

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixDelete(sqlite3_vfs *NotUsed,char *zPath,int dirSync)

{
  int iVar1;
  int *piVar2;
  int local_2c;
  int local_28;
  int fd;
  int rc;
  int dirSync_local;
  char *zPath_local;
  sqlite3_vfs *NotUsed_local;
  
  local_28 = 0;
  fd = dirSync;
  _rc = zPath;
  zPath_local = (char *)NotUsed;
  iVar1 = (*aSyscall[0x10].pCurrent)(zPath);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 2) {
      local_28 = 0x170a;
    }
    else {
      local_28 = unixLogErrorAtLine(0xa0a,"unlink",_rc,0x8e01);
    }
    NotUsed_local._4_4_ = local_28;
  }
  else {
    if ((fd & 1U) != 0) {
      local_28 = (*aSyscall[0x11].pCurrent)(_rc,&local_2c);
      if (local_28 == 0) {
        iVar1 = full_fsync(local_2c,0,0);
        if (iVar1 != 0) {
          local_28 = unixLogErrorAtLine(0x50a,"fsync",_rc,0x8e0b);
        }
        robust_close((unixFile *)0x0,local_2c,0x8e0d);
      }
      else {
        local_28 = 0;
      }
    }
    NotUsed_local._4_4_ = local_28;
  }
  return NotUsed_local._4_4_;
}

Assistant:

static int unixDelete(
  sqlite3_vfs *NotUsed,     /* VFS containing this as the xDelete method */
  const char *zPath,        /* Name of file to be deleted */
  int dirSync               /* If true, fsync() directory after deleting file */
){
  int rc = SQLITE_OK;
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError(return SQLITE_IOERR_DELETE);
  if( osUnlink(zPath)==(-1) ){
    if( errno==ENOENT
#if OS_VXWORKS
        || osAccess(zPath,0)!=0
#endif
    ){
      rc = SQLITE_IOERR_DELETE_NOENT;
    }else{
      rc = unixLogError(SQLITE_IOERR_DELETE, "unlink", zPath);
    }
    return rc;
  }
#ifndef SQLITE_DISABLE_DIRSYNC
  if( (dirSync & 1)!=0 ){
    int fd;
    rc = osOpenDirectory(zPath, &fd);
    if( rc==SQLITE_OK ){
      if( full_fsync(fd,0,0) ){
        rc = unixLogError(SQLITE_IOERR_DIR_FSYNC, "fsync", zPath);
      }
      robust_close(0, fd, __LINE__);
    }else{
      assert( rc==SQLITE_CANTOPEN );
      rc = SQLITE_OK;
    }
  }
#endif
  return rc;
}